

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiSolvers.cc
# Opt level: O1

void __thiscall Glucose::MultiSolvers::adjustNumberOfCores(MultiSolvers *this)

{
  uint uVar1;
  double dVar2;
  
  dVar2 = memUsed();
  if (this->nbthreads == 0) {
    if (0 < this->verb) {
      printf("c |  Automatic Adjustement of the number of solvers. MaxMemory=%5d, MaxCores=%3d.                       |\n"
             ,(ulong)this->maxmemory,(ulong)this->maxnbsolvers);
    }
    uVar1 = (uint)(long)((float)((this->maxmemory << 2) / 10) / (float)dVar2);
    if (this->maxnbsolvers < uVar1) {
      uVar1 = this->maxnbsolvers;
    }
    uVar1 = uVar1 + (uVar1 == 0);
    if (0 < this->verb) {
      printf("c |  One Solver is taking %.2fMb... Let\'s take %d solvers for this run (max 40%% of the maxmemory).       |\n"
             ,(double)(float)dVar2,(ulong)uVar1);
    }
    this->nbsolvers = uVar1;
    this->nbthreads = uVar1;
  }
  return;
}

Assistant:

void MultiSolvers::adjustNumberOfCores() {
    float mem = memUsed();
    if(nbthreads == 0) { // Automatic configuration
        if(verb >= 1)
            printf("c |  Automatic Adjustement of the number of solvers. MaxMemory=%5d, MaxCores=%3d.                       |\n", maxmemory, maxnbsolvers);
        unsigned int tmpnbsolvers = maxmemory * 4 / 10 / mem;
        if(tmpnbsolvers > maxnbsolvers) tmpnbsolvers = maxnbsolvers;
        if(tmpnbsolvers < 1) tmpnbsolvers = 1;
        if(verb >= 1)
            printf("c |  One Solver is taking %.2fMb... Let's take %d solvers for this run (max 40%% of the maxmemory).       |\n", mem, tmpnbsolvers);
        nbsolvers = tmpnbsolvers;
        nbthreads = nbsolvers;
    } else {
        assert(nbthreads == nbsolvers);
    }
}